

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlinsol.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *fp_00;
  doublecomplex *x;
  doublecomplex *x_00;
  int *perm_c_00;
  doublecomplex *sol;
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  FILE *fp;
  SuperLUStat_t stat;
  superlu_options_t options;
  mem_usage_t mem_usage;
  doublecomplex *rhs;
  doublecomplex *xact;
  int_t info;
  int_t nnz;
  int n;
  int m;
  int ldx;
  int nrhs;
  SuperMatrix B;
  NCformat *Ustore;
  SuperMatrix U;
  SCformat *Lstore;
  SuperMatrix L;
  int *perm_r;
  int *perm_c;
  int_t *xa;
  int_t *asub;
  doublecomplex *a;
  NCformat *Astore;
  SuperMatrix A;
  char **argv_local;
  int argc_local;
  
  fp_00 = _stdin;
  A.Store = argv;
  set_default_options((superlu_options_t *)&stat.expansions);
  zreadhb(fp_00,&nnz,&info,(int_t *)((long)&xact + 4),(doublecomplex **)&asub,&xa,&perm_c);
  zCreate_CompCol_Matrix
            ((SuperMatrix *)&Astore,nnz,info,xact._4_4_,(doublecomplex *)asub,xa,perm_c,SLU_NC,SLU_Z
             ,SLU_GE);
  a = (doublecomplex *)A._16_8_;
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)A.Dtype,(ulong)A.Mtype,(ulong)*(uint *)A._16_8_);
  m = 1;
  x = doublecomplexMalloc((long)nnz);
  if (x == (doublecomplex *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhs[].",0x4b,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/zlinsol.c"
           );
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  zCreate_Dense_Matrix((SuperMatrix *)&ldx,nnz,m,x,nnz,SLU_DN,SLU_Z,SLU_GE);
  x_00 = doublecomplexMalloc((long)(info * m));
  n = info;
  zGenXtrue(info,m,x_00,info);
  zFillRHS(options.Equil,m,x_00,n,(SuperMatrix *)&Astore,(SuperMatrix *)&ldx);
  perm_c_00 = int32Malloc(info);
  if (perm_c_00 == (int *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x52,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/zlinsol.c"
           );
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  L.Store = int32Malloc(nnz);
  if ((int *)L.Store == (int *)0x0) {
    sprintf((char *)&sol,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x53,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/zlinsol.c"
           );
    superlu_abort_and_exit((char *)&sol);
  }
  StatInit((SuperLUStat_t *)&fp);
  zgssv((superlu_options_t *)&stat.expansions,(SuperMatrix *)&Astore,perm_c_00,(int *)L.Store,
        (SuperMatrix *)&Lstore,(SuperMatrix *)&Ustore,(SuperMatrix *)&ldx,(SuperLUStat_t *)&fp,
        (int_t *)&xact);
  if ((int)xact == 0) {
    zinf_norm_error(m,(SuperMatrix *)&ldx,x_00);
    U.Store = (void *)L._16_8_;
    B.Store = (void *)U._16_8_;
    printf("No of nonzeros in factor L = %lld\n",(long)*(int *)L._16_8_);
    printf("No of nonzeros in factor U = %lld\n",(long)*B.Store);
    printf("No of nonzeros in L+U = %lld\n",((long)*U.Store + (long)*B.Store) - (long)info);
    printf("FILL ratio = %.1f\n",(double)((float)((*U.Store + *B.Store) - info) / (float)xact._4_4_)
          );
    zQuerySpace((SuperMatrix *)&Lstore,(SuperMatrix *)&Ustore,
                (mem_usage_t *)&options.lookahead_etree);
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)(float)options.lookahead_etree / 1000000.0
           ,(double)(float)options.SymPattern / 1000000.0);
  }
  else {
    printf("zgssv() error returns INFO= %lld\n",(long)(int)xact);
    if ((int)xact <= info) {
      zQuerySpace((SuperMatrix *)&Lstore,(SuperMatrix *)&Ustore,
                  (mem_usage_t *)&options.lookahead_etree);
      printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
             (double)(float)options.lookahead_etree / 1000000.0,
             (double)(float)options.SymPattern / 1000000.0);
    }
  }
  if (options.SolveInitialized != NO) {
    StatPrint((SuperLUStat_t *)&fp);
  }
  StatFree((SuperLUStat_t *)&fp);
  superlu_free(x);
  superlu_free(x_00);
  superlu_free(L.Store);
  superlu_free(perm_c_00);
  Destroy_CompCol_Matrix((SuperMatrix *)&Astore);
  Destroy_SuperMatrix_Store((SuperMatrix *)&ldx);
  Destroy_SuperNode_Matrix((SuperMatrix *)&Lstore);
  Destroy_CompCol_Matrix((SuperMatrix *)&Ustore);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    SuperMatrix A;
    NCformat *Astore;
    doublecomplex   *a;
    int_t    *asub, *xa;
    int      *perm_c; /* column permutation vector */
    int      *perm_r; /* row permutations from partial pivoting */
    SuperMatrix L;      /* factor L */
    SCformat *Lstore;
    SuperMatrix U;      /* factor U */
    NCformat *Ustore;
    SuperMatrix B;
    int      nrhs, ldx, m, n;
    int_t    nnz, info;
    doublecomplex   *xact, *rhs;
    mem_usage_t   mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE      *fp = stdin;
    
#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Set the default input options:
	options.Fact = DOFACT;
        options.Equil = YES;
    	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 1.0;
    	options.Trans = NOTRANS;
    	options.IterRefine = NOREFINE;
    	options.SymmetricMode = NO;
    	options.PivotGrowth = NO;
    	options.ConditionNumber = NO;
    	options.PrintStat = YES;
     */
    set_default_options(&options);

    /* Read the matrix in Harwell-Boeing format. */
    zreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);

    zCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_Z, SLU_GE);
    Astore = A.Store;
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    
    nrhs   = 1;
    if ( !(rhs = doublecomplexMalloc(m * nrhs)) ) ABORT("Malloc fails for rhs[].");
    zCreate_Dense_Matrix(&B, m, nrhs, rhs, m, SLU_DN, SLU_Z, SLU_GE);
    xact = doublecomplexMalloc(n * nrhs);
    ldx = n;
    zGenXtrue(n, nrhs, xact, ldx);
    zFillRHS(options.Trans, nrhs, xact, ldx, &A, &B);

    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");

    /* Initialize the statistics variables. */
    StatInit(&stat);
    
    zgssv(&options, &A, perm_c, perm_r, &L, &U, &B, &stat, &info);
    
    if ( info == 0 ) {

	/* This is how you could access the solution matrix. */
        doublecomplex *sol = (doublecomplex*) ((DNformat*) B.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	 /* Compute the infinity norm of the error. */
	zinf_norm_error(nrhs, &B, xact);

	Lstore = (SCformat *) L.Store;
	Ustore = (NCformat *) U.Store;
    	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    	printf("FILL ratio = %.1f\n", (float)(Lstore->nnz + Ustore->nnz - n)/nnz);
	
	zQuerySpace(&L, &U, &mem_usage);
	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	
    } else {
	printf("zgssv() error returns INFO= %lld\n", (long long)info);
	if ( info <= n ) { /* factorization completes */
	    zQuerySpace(&L, &U, &mem_usage);
	    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
		   mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	}
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (rhs);
    SUPERLU_FREE (xact);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperNode_Matrix(&L);
    Destroy_CompCol_Matrix(&U);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif

    return EXIT_SUCCESS;
}